

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O3

void __thiscall
EightBallIRCCommand::trigger
          (EightBallIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  int iVar1;
  int *piVar2;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  size_type __rlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  char *local_30;
  
  local_58._M_str = nick._M_str;
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  piVar2 = (int *)channel._M_str;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_58._M_len = (size_t)args_2;
  iVar1 = rand();
  switch(iVar1 % 0x1f) {
  case 0:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"No.",3);
    break;
  case 1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Yes.",4);
    break;
  case 2:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Maybe.",6);
    break;
  case 3:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Seven.",6);
    break;
  case 4:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Consider counseling.",0x14);
    break;
  case 5:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Look into a realationship. A real one.",0x26);
    break;
  case 6:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Quit asking me these deep questions, before I get deeply into you.",0x42);
    break;
  case 7:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Fuck you.",9);
    break;
  case 8:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Fuck me.",8);
    break;
  case 9:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Good thing I bend that way!",0x1b);
    break;
  case 10:
    local_38 = 4;
    local_30 = "Hai ";
    local_48._M_len = 1;
    local_48._M_str = "!";
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_78,(jessilib *)&local_38,&local_58,&local_48,args_2);
    goto LAB_00104a30;
  case 0xb:
    local_38 = 10;
    local_30 = "Let\'s ban ";
    local_48._M_len = 1;
    local_48._M_str = "!";
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_78,(jessilib *)&local_38,&local_58,&local_48,args_2);
LAB_00104a30:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0xc:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Fuck your lineage.",0x12);
    break;
  case 0xd:
    if ((channel._M_len == 5) && ((char)piVar2[1] == 'l' && *piVar2 == 0x69614a23)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_98,0,local_98._M_string_length,"Ask me those kind of questions in #Politics"
                 ,0x2b);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_98,0,local_98._M_string_length,"Ask me those kind of questions in #Jail",
                 0x27);
    }
    break;
  case 0xe:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"I don\'t talk to slut-mongers.",0x1d);
    break;
  case 0xf:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"I only talk to slut-mongers.",0x1c);
    break;
  case 0x10:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Nuclear launch detected.",0x18);
    break;
  case 0x11:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"404 - Not found.",0x10);
    break;
  case 0x12:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"I hurr u liek mudkipz?",0x16);
    break;
  case 0x13:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Fortune might be in your favor.",0x1f);
    break;
  case 0x14:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Fortune might not be in your favor.",0x23);
    break;
  case 0x15:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, you\'re going to hell."
               ,0x8e);
    break;
  case 0x16:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, yes!"
               ,0x7d);
    break;
  case 0x17:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, it\'s approximately as likely as getting a \"yes\" from me."
               ,0xb1);
    break;
  case 0x18:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Fucking campers.",0x10);
    break;
  case 0x19:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "The 8ball seems to be stuck. Try again later. (Dang, you can\'t even get an 8ball to work for you? That\'s pretty sad yo)"
               ,0x77);
    break;
  case 0x1a:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "The 8ball says... Go away? Wow, it really must not like you. Go away.",0x45);
    break;
  case 0x1b:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Swag",4);
    break;
  case 0x1c:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Based on the orbit and trajectory of the 33rd moon of the planet assinine 6, no.",
               0x50);
    break;
  case 0x1d:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Based on the orbin and trajectory of the moon assinsix 9, yes!",0x3e);
    break;
  case 0x1e:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,
               "Come visit me on the 5th planet away from Sol, and I\'ll give you whatever you want."
               ,0x53);
    break;
  default:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_98,0,local_98._M_string_length,"Nothingness. You suck. Go rot.",0x1e);
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel._M_len,piVar2,local_98._M_string_length,local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EightBallIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string msg;
	switch (rand() % 31)
	{
	case 0:
		msg = "No."sv;
		break;
	case 1:
		msg = "Yes."sv;
		break;
	case 2:
		msg = "Maybe."sv;
		break;
	case 3:
		msg = "Seven."sv;
		break;
	case 4:
		msg = "Consider counseling."sv;
		break;
	case 5:
		msg = "Look into a realationship. A real one."sv;
		break;
	case 6:
		msg = "Quit asking me these deep questions, before I get deeply into you."sv;
		break;
	case 7:
		msg = "Fuck you."sv;
		break;
	case 8:
		msg = "Fuck me."sv;
		break;
	case 9:
		msg = "Good thing I bend that way!"sv;
		break;
	case 10:
		msg = jessilib::join<std::string>("Hai "sv, nick, "!"sv);
		break;
	case 11:
		msg = jessilib::join<std::string>("Let's ban "sv, nick, "!"sv);
		break;
	case 12:
		msg = "Fuck your lineage."sv;
		break;
	case 13:
		if (channel == "#Jail"sv) {
			msg = "Ask me those kind of questions in #Politics"sv;
		}
		else {
			msg = "Ask me those kind of questions in #Jail"sv;
		}
		break;
	case 14:
		msg = "I don't talk to slut-mongers."sv;
		break;
	case 15:
		msg = "I only talk to slut-mongers."sv;
		break;
	case 16:
		msg = "Nuclear launch detected."sv;
		break;
	case 17:
		msg = "404 - Not found."sv;
		break;
	case 18:
		msg = "I hurr u liek mudkipz?"sv;
		break;
	case 19:
		msg = "Fortune might be in your favor."sv;
		break;
	case 20:
		msg = "Fortune might not be in your favor."sv;
		break;
	case 21:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, you're going to hell."sv;
		break;
	case 22:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, yes!"sv;
		break;
	case 23:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, it's approximately as likely as getting a \"yes\" from me."sv;
		break;
	case 24:
		msg = "Fucking campers."sv;
		break;
	case 25:
		msg = "The 8ball seems to be stuck. Try again later. (Dang, you can't even get an 8ball to work for you? That's pretty sad yo)"sv;
		break;
	case 26:
		msg = "The 8ball says... Go away? Wow, it really must not like you. Go away."sv;
		break;
	case 27:
		msg = "Swag"sv;
		break;
	case 28:
		msg = "Based on the orbit and trajectory of the 33rd moon of the planet assinine 6, no."sv;
		break;
	case 29:
		msg = "Based on the orbin and trajectory of the moon assinsix 9, yes!"sv;
		break;
	case 30:
		msg = "Come visit me on the 5th planet away from Sol, and I'll give you whatever you want."sv;
		break;
	default:
		msg = "Nothingness. You suck. Go rot."sv;
		break;
	}
	source->sendMessage(channel, msg);
}